

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_cursor.c
# Opt level: O0

_Bool ts_tree_cursor_child_iterator_next
                (CursorChildIterator *self,TreeCursorEntry *result,_Bool *visible)

{
  uint32_t uVar1;
  undefined8 uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  _Bool _Var5;
  Subtree *pSVar6;
  Length LVar7;
  undefined8 local_110;
  uint32_t local_108;
  Subtree next_child;
  uint32_t local_a8;
  _Bool extra;
  undefined4 uStack_34;
  Subtree *child;
  _Bool *visible_local;
  TreeCursorEntry *result_local;
  CursorChildIterator *self_local;
  
  if (((self->parent).ptr == (SubtreeHeapData *)0x0) ||
     (self->child_index == ((self->parent).ptr)->child_count)) {
    self_local._7_1_ = false;
  }
  else {
    pSVar6 = (((self->parent).ptr)->field_17).field_0.children + self->child_index;
    uVar3 = (self->position).bytes;
    uVar4 = (self->position).extent.row;
    uVar2 = *(undefined8 *)&(self->position).extent.column;
    uVar1 = self->structural_child_index;
    result->subtree = pSVar6;
    (result->position).bytes = uVar3;
    (result->position).extent.row = uVar4;
    *(undefined8 *)&(result->position).extent.column = uVar2;
    *(ulong *)&result->structural_child_index = CONCAT44(uStack_34,uVar1);
    _Var5 = ts_subtree_visible(*pSVar6);
    *visible = _Var5;
    _Var5 = ts_subtree_extra(*pSVar6);
    if ((!_Var5) && (self->alias_sequence != (TSSymbol *)0x0)) {
      *visible = (*visible & 1U) != 0 || self->alias_sequence[self->structural_child_index] != 0;
    }
    LVar7 = ts_subtree_size(*pSVar6);
    LVar7 = length_add(self->position,LVar7);
    next_child = LVar7._0_8_;
    local_a8 = LVar7.extent.column;
    *(Subtree *)&self->position = next_child;
    (self->position).extent.column = local_a8;
    self->child_index = self->child_index + 1;
    if (!_Var5) {
      self->structural_child_index = self->structural_child_index + 1;
    }
    if (self->child_index < ((self->parent).ptr)->child_count) {
      LVar7 = ts_subtree_padding((((self->parent).ptr)->field_17).field_0.children
                                 [self->child_index]);
      LVar7 = length_add(self->position,LVar7);
      local_110 = LVar7._0_8_;
      local_108 = LVar7.extent.column;
      (self->position).bytes = (undefined4)local_110;
      (self->position).extent.row = local_110._4_4_;
      (self->position).extent.column = local_108;
    }
    self_local._7_1_ = true;
  }
  return self_local._7_1_;
}

Assistant:

static inline bool ts_tree_cursor_child_iterator_next(CursorChildIterator *self,
                                                      TreeCursorEntry *result,
                                                      bool *visible) {
  if (!self->parent.ptr || self->child_index == self->parent.ptr->child_count) return false;
  const Subtree *child = &self->parent.ptr->children[self->child_index];
  *result = (TreeCursorEntry) {
    .subtree = child,
    .position = self->position,
    .child_index = self->child_index,
    .structural_child_index = self->structural_child_index,
  };
  *visible = ts_subtree_visible(*child);
  bool extra = ts_subtree_extra(*child);
  if (!extra && self->alias_sequence) {
    *visible |= self->alias_sequence[self->structural_child_index];
  }

  self->position = length_add(self->position, ts_subtree_size(*child));
  self->child_index++;
  if (!extra) self->structural_child_index++;

  if (self->child_index < self->parent.ptr->child_count) {
    Subtree next_child = self->parent.ptr->children[self->child_index];
    self->position = length_add(self->position, ts_subtree_padding(next_child));
  }

  return true;
}